

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_0::TestNoexceptObject::~TestNoexceptObject(TestNoexceptObject *this)

{
  bool bVar1;
  bool local_41;
  DebugExpression<int_&> DStack_40;
  bool _kj_shouldLog;
  undefined1 local_38 [8];
  DebugComparison<int_&,_int_&> _kjCondition;
  TestNoexceptObject *this_local;
  
  if (this->index == -1) {
    kj::(anonymous_namespace)::TestNoexceptObject::copiedCount =
         kj::(anonymous_namespace)::TestNoexceptObject::copiedCount + -1;
  }
  else {
    kj::(anonymous_namespace)::TestNoexceptObject::count =
         kj::(anonymous_namespace)::TestNoexceptObject::count + -1;
    _kjCondition._32_8_ = this;
    DStack_40 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->index);
    kj::_::DebugExpression<int&>::operator==
              ((DebugComparison<int_&,_int_&> *)local_38,
               (DebugExpression<int&> *)&stack0xffffffffffffffc0,
               &kj::(anonymous_namespace)::TestNoexceptObject::count);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
    if (!bVar1) {
      local_41 = kj::_::Debug::shouldLog(ERROR);
      while (local_41 != false) {
        kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int&,int&>&,int&,int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                   ,0x4e,ERROR,
                   "\"failed: expected \" \"(index) == (count)\", _kjCondition, index, count",
                   (char (*) [36])"failed: expected (index) == (count)",
                   (DebugComparison<int_&,_int_&> *)local_38,&this->index,
                   &kj::(anonymous_namespace)::TestNoexceptObject::count);
        local_41 = false;
      }
    }
  }
  return;
}

Assistant:

~TestNoexceptObject() noexcept {
    if (index == -1) {
      --copiedCount;
    } else {
      --count;
      EXPECT_EQ(index, count);
    }
  }